

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O2

int __thiscall ON_String::Remove(ON_String *this,char utf8_single_byte_c)

{
  int iVar1;
  ON_Internal_Empty_aString *pOVar2;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  
  iVar1 = ON_IsValidSingleByteUTF8CharValue(utf8_single_byte_c);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    CopyArray(this);
    pcVar5 = this->m_s;
    pOVar2 = (ON_Internal_Empty_aString *)(pcVar5 + -0xc);
    if (pcVar5 == (char *)0x0) {
      pOVar2 = &empty_astring;
    }
    pcVar3 = pcVar5 + (pOVar2->header).string_length;
    pcVar6 = pcVar5;
    for (pcVar7 = pcVar5; (iVar4 = (int)pcVar5, pcVar7 != (char *)0x0 && (pcVar7 < pcVar3));
        pcVar7 = pcVar7 + 1) {
      if (*pcVar7 != utf8_single_byte_c) {
        *pcVar6 = *pcVar7;
        pcVar6 = pcVar6 + 1;
      }
      pcVar5 = (char *)(ulong)(iVar4 + 1);
    }
    *pcVar6 = '\0';
    iVar1 = iVar4 - (int)pcVar6;
    pOVar2 = (ON_Internal_Empty_aString *)(this->m_s + -0xc);
    if (this->m_s == (char *)0x0) {
      pOVar2 = &empty_astring;
    }
    (pOVar2->header).string_length = ((int)pcVar6 + (pOVar2->header).string_length) - iVar4;
  }
  return iVar1;
}

Assistant:

int ON_String::Remove(const char utf8_single_byte_c)
{
  if (false == ON_IsValidSingleByteUTF8CharValue(utf8_single_byte_c))
    return 0;

  CopyArray();

  char* pstrSource = m_s;
  char* pstrDest = m_s;
  char* pstrEnd = m_s + Length();

  while( pstrSource && pstrSource  < pstrEnd)
  {
    if (*pstrSource != utf8_single_byte_c)
    {
      *pstrDest = *pstrSource;
      pstrDest++;
    }
    pstrSource++;
  }

  *pstrDest = 0;
  int nCount = (int)(pstrSource - pstrDest); // the (int) is for 64 bit size_t conversion

  Header()->string_length -= nCount;

  return nCount;
}